

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O0

string * ON_UTF_WideChar_to_std_string_abi_cxx11_
                   (int bTestByteOrder,wchar_t *sInputUTF,int sInputUTF_count,uint *error_status,
                   uint error_mask,ON__UINT32 error_code_point,int *end_element_index)

{
  undefined4 in_register_00000014;
  undefined4 in_register_0000003c;
  string *this;
  undefined4 in_register_00000084;
  undefined4 *in_stack_00000010;
  undefined4 in_stack_ffffffffffffff7c;
  string local_60 [32];
  long local_40;
  wchar_t *sEndElement;
  undefined8 uStack_30;
  uint error_mask_local;
  uint *error_status_local;
  long lStack_20;
  int sInputUTF_count_local;
  wchar_t *sInputUTF_local;
  string *psStack_10;
  int bTestByteOrder_local;
  string *str;
  
  uStack_30 = CONCAT44(in_register_00000084,error_mask);
  this = (string *)CONCAT44(in_register_0000003c,bTestByteOrder);
  lStack_20 = CONCAT44(in_register_00000014,sInputUTF_count);
  sInputUTF_local._4_4_ = (uint)sInputUTF;
  error_status_local._4_4_ = (uint)error_status;
  sEndElement._3_1_ = 0;
  sEndElement._4_4_ = error_code_point;
  psStack_10 = this;
  std::__cxx11::string::string(this);
  local_40 = lStack_20;
  ON_UTF32_to_std_string_abi_cxx11_
            ((int)local_60,(ON__UINT32 *)(ulong)sInputUTF_local._4_4_,(int)lStack_20,
             (uint *)(ulong)error_status_local._4_4_,(uint)uStack_30,sEndElement._4_4_,
             (ON__UINT32 **)CONCAT44(in_stack_ffffffffffffff7c,end_element_index._0_4_));
  std::__cxx11::string::operator=(this,local_60);
  std::__cxx11::string::~string(local_60);
  if (in_stack_00000010 != (undefined4 *)0x0) {
    *in_stack_00000010 = (int)(local_40 - lStack_20 >> 2);
  }
  return this;
}

Assistant:

std::string ON_UTF_WideChar_to_std_string(
  int bTestByteOrder,
  const wchar_t* sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::string str;
  const wchar_t* sEndElement = sInputUTF;

  switch(sizeof(wchar_t))
  {
  case sizeof(char):
    str = ON_UTF8_to_std_string(
      bTestByteOrder,
      (const char*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const char**)&sEndElement
      );
    break;

  case sizeof(ON__UINT16):
    str = ON_UTF16_to_std_string(
      bTestByteOrder,
      (const ON__UINT16*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const ON__UINT16**)&sEndElement
      );
    break;

  case sizeof(ON__UINT32):
    str = ON_UTF32_to_std_string(
      bTestByteOrder,
      (const ON__UINT32*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const ON__UINT32**)&sEndElement
      );
    break;

  default:
    if ( 0 != error_status )
      *error_status = 1;
    break;
  }

  if ( 0 != end_element_index )
    *end_element_index = static_cast<int>(sEndElement - sInputUTF);

  return str;
}